

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentPOMDP.cpp
# Opt level: O0

void __thiscall AgentPOMDP::AgentPOMDP(AgentPOMDP *this,AgentPOMDP *a)

{
  undefined8 uVar1;
  int iVar2;
  PlanningUnitDecPOMDPDiscrete *pPVar3;
  undefined4 extraout_var;
  long in_RSI;
  AgentDecPOMDPDiscrete *in_RDI;
  AgentSharedObservations *in_stack_ffffffffffffffc8;
  
  AgentSharedObservations::AgentSharedObservations
            ((AgentSharedObservations *)in_RDI,in_stack_ffffffffffffffc8);
  (in_RDI->super_SimulationAgent)._vptr_SimulationAgent = (_func_int **)&PTR__AgentPOMDP_00d0d878;
  in_RDI[1].super_SimulationAgent._vptr_SimulationAgent = *(_func_int ***)(in_RSI + 0x18);
  uVar1 = *(undefined8 *)(in_RSI + 0x20);
  in_RDI[1].super_SimulationAgent._m_id = (int)uVar1;
  in_RDI[1].super_SimulationAgent._m_verbose = (bool)(char)((ulong)uVar1 >> 0x20);
  *(int3 *)&in_RDI[1].super_SimulationAgent.field_0xd = (int3)((ulong)uVar1 >> 0x28);
  *(undefined4 *)&in_RDI[2].super_SimulationAgent._vptr_SimulationAgent =
       *(undefined4 *)(in_RSI + 0x30);
  pPVar3 = AgentDecPOMDPDiscrete::GetPU(in_RDI);
  iVar2 = (*(pPVar3->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[10])();
  in_RDI[1]._m_pu = (PlanningUnitDecPOMDPDiscrete *)CONCAT44(extraout_var,iVar2);
  (*((in_RDI[1]._m_pu)->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0x15])
            (in_RDI[1]._m_pu,*(undefined8 *)(in_RSI + 0x28));
  return;
}

Assistant:

AgentPOMDP::AgentPOMDP(const AgentPOMDP& a) :
    AgentSharedObservations(a),
    _m_QPOMDP(a._m_QPOMDP),
    _m_t(a._m_t),
    _m_prevJaI(a._m_prevJaI)
{
    _m_jb=GetPU()->GetNewJointBeliefInterface();
    *_m_jb=*a._m_jb;
}